

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::TablePrinter>
Catch::Detail::
make_unique<Catch::TablePrinter,std::ostream&,std::vector<Catch::ColumnInfo,std::allocator<Catch::ColumnInfo>>>
          (basic_ostream<char,_std::char_traits<char>_> *args,
          vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *args_1)

{
  TablePrinter *ptr;
  vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *in_RSI;
  TablePrinter *in_RDI;
  vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *in_stack_ffffffffffffff88;
  TablePrinter *this;
  ostream *os;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffc4;
  ostream local_30 [32];
  vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  ptr = (TablePrinter *)operator_new(0x38);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  os = local_30;
  std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>::vector
            ((vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *)this,
             in_stack_ffffffffffffff88);
  TablePrinter::TablePrinter((TablePrinter *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),os,local_10);
  unique_ptr<Catch::TablePrinter>::unique_ptr((unique_ptr<Catch::TablePrinter> *)this,ptr);
  std::vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>::~vector
            ((vector<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_> *)ptr);
  return (unique_ptr<Catch::TablePrinter>)in_RDI;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }